

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Framebuffer.cpp
# Opt level: O2

Ptr<Framebuffer> __thiscall
myvk::Framebuffer::Create
          (Framebuffer *this,Ptr<RenderPass> *render_pass,
          vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
          *image_views,VkExtent2D *extent,uint32_t layers)

{
  pointer psVar1;
  element_type *peVar2;
  PFN_vkCreateFramebuffer p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  uint uVar5;
  int iVar6;
  VkResult VVar7;
  ulong uVar8;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<Framebuffer> PVar9;
  shared_ptr<myvk::Framebuffer> ret;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> attachments;
  _func_int **local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  _Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> local_90;
  undefined1 local_78 [56];
  ulong uStack_40;
  
  std::make_shared<myvk::Framebuffer>();
  std::__shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 3),
             &render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::operator=((vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
               *)(local_a8 + 8),image_views);
  *(VkExtent2D *)(local_a8 + 6) = *extent;
  *(uint32_t *)(local_a8 + 7) = layers;
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::vector
            ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)&local_90,
             (long)(image_views->
                   super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(image_views->
                   super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_78);
  uVar5 = 0;
  while( true ) {
    p_Var3 = vkCreateFramebuffer;
    uVar8 = (ulong)uVar5;
    psVar1 = (image_views->
             super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(image_views->
                      super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar8)
    break;
    local_90._M_impl.super__Vector_impl_data._M_start[uVar8] =
         (psVar1[uVar8].super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_image_view;
    uVar5 = uVar5 + 1;
  }
  local_78._8_8_ = (void *)0x0;
  local_78._16_8_ = 0;
  local_78._0_8_ = 0x25;
  peVar2 = (render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78._24_8_ = peVar2->m_render_pass;
  local_78._32_8_ =
       (ulong)((long)local_90._M_impl.super__Vector_impl_data._M_finish -
              (long)local_90._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  local_78._40_8_ = local_90._M_impl.super__Vector_impl_data._M_start;
  local_78._48_8_ = *extent;
  uStack_40 = (ulong)layers;
  iVar6 = (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar7 = (*p_Var3)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar6) + 0x268),
                    (VkFramebufferCreateInfo *)local_78,(VkAllocationCallbacks *)0x0,
                    (VkFramebuffer *)(local_a8 + 5));
  _Var4._M_pi = a_Stack_a0[0]._M_pi;
  if (VVar7 == VK_SUCCESS) {
    a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base._vptr_Base = local_a8;
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var4._M_pi;
  }
  else {
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_FramebufferBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::_Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::~_Vector_base(&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a0);
  PVar9.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar9.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Framebuffer>)PVar9.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Framebuffer> Framebuffer::Create(const Ptr<RenderPass> &render_pass, const std::vector<Ptr<ImageView>> &image_views,
                                     const VkExtent2D &extent, uint32_t layers) {
	auto ret = std::make_shared<Framebuffer>();
	ret->m_render_pass_ptr = render_pass;
	ret->m_image_view_ptrs = image_views;
	ret->m_extent = extent;
	ret->m_layers = layers;

	std::vector<VkImageView> attachments(image_views.size());
	for (uint32_t i = 0; i < image_views.size(); ++i)
		attachments[i] = image_views[i]->GetHandle();

	VkFramebufferCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
	create_info.renderPass = render_pass->GetHandle();
	create_info.attachmentCount = attachments.size();
	create_info.pAttachments = attachments.data();
	create_info.width = extent.width;
	create_info.height = extent.height;
	create_info.layers = layers;

	if (vkCreateFramebuffer(render_pass->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_framebuffer) !=
	    VK_SUCCESS)
		return nullptr;

	return ret;
}